

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock
          (ThreadSafeArena *this,void *buf,size_t size,AllocationPolicy *policy)

{
  bool bVar1;
  LogMessage *pLVar2;
  undefined1 auVar3 [16];
  SizedPtr SVar4;
  ThreadSafeArena *local_98;
  void *local_90;
  ThreadSafeArena *local_88;
  SizedPtr mem;
  LogMessageFatal local_58 [19];
  Voidify local_45;
  uint local_44;
  unsigned_long local_40;
  string *local_38;
  string *absl_log_internal_check_op_result;
  AllocationPolicy *policy_local;
  size_t size_local;
  void *buf_local;
  ThreadSafeArena *this_local;
  
  absl_log_internal_check_op_result = (string *)policy;
  policy_local = (AllocationPolicy *)size;
  size_local = (size_t)buf;
  buf_local = this;
  bVar1 = AllocationPolicy::IsDefault(policy);
  if (bVar1) {
    this_local = (ThreadSafeArena *)FirstBlock(this,(void *)size_local,(size_t)policy_local);
  }
  else {
    local_40 = absl::lts_20240722::log_internal::GetReferenceableValue(size_local & 7);
    local_44 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
    local_38 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                         (&local_40,&local_44,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
    if (local_38 != (string *)0x0) {
      auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/arena.cc"
                 ,0x252,auVar3._0_8_,auVar3._8_8_);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_45,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
    }
    if ((size_local == 0) || (policy_local < (AllocationPolicy *)0x30)) {
      SVar4 = anon_unknown_12::AllocateBlock
                        ((AllocationPolicy *)absl_log_internal_check_op_result,0,0x20);
      local_98 = (ThreadSafeArena *)SVar4.p;
      local_88 = local_98;
      local_90 = (void *)SVar4.n;
      mem.p = local_90;
    }
    else {
      local_88 = (ThreadSafeArena *)size_local;
      mem.p = policy_local;
      TaggedAllocationPolicyPtr::set_is_user_owned_initial_block(&this->alloc_policy_,true);
    }
    ArenaBlock::ArenaBlock((ArenaBlock *)local_88,(ArenaBlock *)0x0,(size_t)mem.p);
    this_local = local_88;
  }
  return (ArenaBlock *)this_local;
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size,
                                        const AllocationPolicy& policy) {
  if (policy.IsDefault()) return FirstBlock(buf, size);

  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);

  SizedPtr mem;
  if (buf == nullptr || size < kBlockHeaderSize + kAllocPolicySize) {
    mem = AllocateBlock(&policy, 0, kAllocPolicySize);
  } else {
    mem = {buf, size};
    // Record user-owned block.
    alloc_policy_.set_is_user_owned_initial_block(true);
  }

  return new (mem.p) ArenaBlock{nullptr, mem.n};
}